

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

bool __thiscall Sock::IsConnected(Sock *this,string *errmsg)

{
  int iVar1;
  undefined4 extraout_var;
  int *piVar2;
  char *__s;
  size_type __len1;
  bool bVar3;
  size_type __len2;
  long in_FS_OFFSET;
  char c;
  int in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_socket == 0xffffffff) {
    __len1 = errmsg->_M_string_length;
    __s = "not connected";
    __len2 = 0xd;
  }
  else {
    iVar1 = (*this->_vptr_Sock[4])(this,&stack0xffffffffffffffbf,1,2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      bVar3 = true;
      if (CONCAT44(extraout_var,iVar1) == -1) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        bVar3 = false;
        if (((iVar1 != 4) && (bVar3 = false, iVar1 != 0xb)) && (iVar1 != 0x73)) {
          bVar3 = true;
        }
        if (bVar3) {
          SysErrorString_abi_cxx11_(in_stack_ffffffffffffffbc);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (errmsg,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
        }
        bVar3 = (bool)(bVar3 ^ 1);
      }
      goto LAB_00770525;
    }
    __len1 = errmsg->_M_string_length;
    __s = "closed";
    __len2 = 6;
  }
  bVar3 = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (errmsg,0,__len1,__s,__len2);
LAB_00770525:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::IsConnected(std::string& errmsg) const
{
    if (m_socket == INVALID_SOCKET) {
        errmsg = "not connected";
        return false;
    }

    char c;
    switch (Recv(&c, sizeof(c), MSG_PEEK)) {
    case -1: {
        const int err = WSAGetLastError();
        if (IOErrorIsPermanent(err)) {
            errmsg = NetworkErrorString(err);
            return false;
        }
        return true;
    }
    case 0:
        errmsg = "closed";
        return false;
    default:
        return true;
    }
}